

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(unsigned_long lhs,SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *result_00;
  unsigned_long ret;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  unsigned_long local_40;
  long local_38 [2];
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_28;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  
  result_00 = &local_28;
  local_28.m_int = 0;
  local_40 = lhs;
  bVar1 = DivisionCornerCaseHelper<long,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1(lhs,rhs,result_00);
  if (!bVar1) {
    local_38[1] = 0;
    local_38[0] = rhs.m_int;
    DivisionHelper<unsigned_long,_long,_1>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (&local_40,local_38,(unsigned_long *)(local_38 + 1));
    result_00 = &local_20;
    SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_long>
              (result_00,(unsigned_long *)(local_38 + 1));
  }
  return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)result_00->m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}